

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector4D.cpp
# Opt level: O2

ostream * CMU462::operator<<(ostream *os,Vector4D *v)

{
  ostream *poVar1;
  
  std::operator<<(os,"(");
  poVar1 = std::ostream::_M_insert<double>(v->x);
  std::operator<<(poVar1,",");
  poVar1 = std::ostream::_M_insert<double>(v->y);
  std::operator<<(poVar1,",");
  poVar1 = std::ostream::_M_insert<double>(v->z);
  std::operator<<(poVar1,",");
  poVar1 = std::ostream::_M_insert<double>(v->w);
  std::operator<<(poVar1,")");
  return os;
}

Assistant:

std::ostream& operator<<( std::ostream& os, const Vector4D& v ) {
    os << "(" << v.x << "," << v.y << "," << v.z << "," << v.w << ")";
    return os;
  }